

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

void set_vbp_thresholds(AV1_COMP *cpi,int64_t *thresholds,uint64_t blk_sad,int qindex,
                       int content_lowsumdiff,int source_sad_nonrd,int source_sad_rd,
                       _Bool is_segment_id_boosted,int lighting_change)

{
  uint uVar1;
  double dVar2;
  int16_t iVar3;
  int i;
  NOISE_LEVEL NVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  double dVar19;
  
  bVar6 = (cpi->common).current_frame.frame_type;
  lVar15 = 1;
  if ((bVar6 & 0xfd) == 0) {
    lVar15 = 0x78;
  }
  iVar3 = av1_ac_quant_QTX(qindex,0,((cpi->common).seq_params)->bit_depth);
  lVar15 = iVar3 * lVar15;
  uVar10 = (cpi->common).height * (cpi->common).width;
  bVar5 = (byte)(cpi->sf).rt_sf.var_part_split_threshold_shift;
  if ((bVar6 & 0xfd) == 0) {
    iVar16 = (cpi->sf).rt_sf.force_large_partition_blocks_intra;
    if (iVar16 != 0) {
      lVar15 = lVar15 << ((((cpi->oxcf).mode == '\x02') + bVar5) - 8 & 0x3f);
    }
    *thresholds = lVar15;
    thresholds[1] = lVar15;
    if ((int)uVar10 < 0xe1000) {
      lVar11 = lVar15 / 3;
      lVar12 = lVar15 >> 1;
    }
    else {
      lVar11 = lVar15 >> (iVar16 == 0) * '\x02';
      lVar12 = lVar11;
    }
    thresholds[2] = lVar11;
    thresholds[3] = lVar12;
    thresholds[4] = lVar15 << 2;
    return;
  }
  uVar1 = (cpi->common).quant_params.base_qindex;
  if ((((0x4b000 < (int)uVar10) && (content_lowsumdiff != 0)) &&
      ((cpi->noise_estimate).enabled != 0)) && (0x3c < (cpi->common).current_frame.frame_number)) {
    NVar4 = av1_noise_estimate_extract_level(&cpi->noise_estimate);
    if (NVar4 == kMedium) {
      if ((cpi->sf).rt_sf.prefer_large_partition_blocks == 0) {
        lVar15 = lVar15 + (lVar15 >> 2);
      }
    }
    else if (NVar4 == kHigh) {
      lVar15 = lVar15 * 5 >> 1;
    }
  }
  iVar16 = (cpi->oxcf).speed;
  lVar12 = lVar15 >> 1;
  if ((cpi->rc).frame_source_sad == 0) {
    lVar12 = 0;
  }
  if ((cpi->ppi->rtc_ref).non_reference_frame == 0) {
    lVar12 = 0;
  }
  lVar11 = lVar12 + lVar15 >> 2;
  if (iVar16 < 8) {
    lVar11 = 0;
  }
  lVar11 = lVar11 + lVar12 + lVar15;
  if ((2 < source_sad_nonrd && 10 < iVar16) && ((cpi->rc).high_motion_content_screen_rtc != 0)) {
    lVar11 = lVar11 * 0x10;
  }
  lVar15 = lVar11 >> 1;
  lVar12 = lVar11 << (bVar5 & 0x3f);
  *thresholds = lVar15;
  thresholds[1] = lVar11;
  thresholds[3] = lVar12;
  if ((int)uVar10 < 0xe1000) {
    if (0x18c00 < (int)uVar10) {
      lVar15 = (lVar11 >> 2) + lVar11;
      goto LAB_002221bb;
    }
    uVar17 = (cpi->sf).rt_sf.var_part_based_on_qidx;
    uVar7 = 0;
    if (0 < (int)uVar17) {
      uVar7 = uVar17;
    }
    if (2 < source_sad_rd) {
      uVar7 = 0;
    }
    if (2 < (int)uVar17) {
      uVar7 = uVar17;
    }
    iVar16 = (&DAT_00466b74)[(ulong)uVar7 * 2];
    if (iVar16 - uVar1 == 0 || iVar16 < (int)uVar1) {
      lVar12 = lVar11 * 5 >> 1;
      lVar8 = lVar11 * 5 >> 4;
      thresholds[1] = lVar8;
      lVar15 = lVar12 * 4;
      thresholds[2] = lVar15;
      lVar12 = lVar12 << 5;
LAB_002221a8:
      thresholds[3] = lVar12;
    }
    else {
      iVar18 = (&DAT_00466b70)[(ulong)uVar7 * 2];
      if (iVar18 <= (int)uVar1) {
        lVar14 = (long)(int)(uVar1 - iVar18);
        lVar12 = (long)(int)(iVar16 - uVar1);
        uVar13 = 1;
        if (1 < iVar16 - iVar18) {
          uVar13 = (ulong)(uint)(iVar16 - iVar18);
        }
        lVar11 = (lVar11 * lVar12 + (lVar11 * 5 >> 1) * lVar14) / (long)uVar13;
        lVar8 = lVar11 >> 3;
        thresholds[1] = lVar8;
        lVar15 = ((lVar11 >> 1) * lVar12 + lVar11 * lVar14) / (long)uVar13;
        thresholds[2] = lVar15;
        lVar12 = ((lVar14 * 0x20 + lVar12 * 8) * lVar11) / (long)uVar13;
        goto LAB_002221a8;
      }
      lVar8 = lVar11 >> 3;
      thresholds[1] = lVar8;
      thresholds[2] = lVar15;
      lVar12 = lVar11 << 3;
      thresholds[3] = lVar12;
    }
  }
  else {
    lVar12 = lVar12 * 2;
    thresholds[3] = lVar12;
    if (uVar10 < 0x1fa400) {
      lVar15 = lVar11 * 2;
    }
    else if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
      if (uVar10 < 0x384000) {
        lVar15 = lVar11 * 5;
      }
      else {
        lVar15 = lVar11 * 7;
      }
      lVar15 = lVar15 >> 1;
    }
    else if (iVar16 < 8) {
      lVar15 = lVar11 * 3;
    }
    else {
      lVar15 = lVar11 * 6;
    }
LAB_002221bb:
    thresholds[2] = lVar15;
    lVar8 = lVar11;
  }
  iVar16 = (cpi->sf).rt_sf.prefer_large_partition_blocks;
  if (iVar16 < 3) {
    if (iVar16 == 2) {
      lVar12 = lVar15 * 3;
      if (2 < source_sad_nonrd) {
        lVar12 = lVar15;
      }
      thresholds[1] = lVar8 << (source_sad_nonrd < 3) * '\x02';
      thresholds[2] = lVar12;
      goto LAB_002224db;
    }
    if (iVar16 < 1) goto LAB_002224db;
    dVar19 = 1.0;
    if (((0x36 < (int)uVar1) && (dVar19 = 0.0, uVar1 < 0x92)) && (0xffffffa5 < uVar1 - 0x91)) {
      dVar19 = 1.0;
    }
    dVar2 = 1.0 - dVar19;
    thresholds[1] = (long)(int)((double)(lVar8 * 2) * dVar2 + (double)lVar8 * dVar19);
    thresholds[2] = (long)(int)((double)(lVar15 * 2) * dVar2 + (double)lVar15 * dVar19);
    lVar15 = (long)(int)((double)(lVar12 << (source_sad_nonrd < 3) + 1) * dVar2 +
                        (double)lVar12 * dVar19);
  }
  else {
    if (((int)uVar1 < 0x50) || ((uVar17 = 0, uVar1 < 0x79 && (0xffffffd7 < uVar1 - 0x78)))) {
      uVar17 = 0x3ff00000;
    }
    if (0x4b000 < (int)uVar10) {
      for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
        thresholds[lVar15] = thresholds[lVar15] << 1;
      }
    }
    if (0x18c00 < (int)uVar10) {
      if ((int)uVar10 < 0x4b001 || is_segment_id_boosted) {
        if ((100 < (int)uVar1 && !is_segment_id_boosted) &&
           ((source_sad_nonrd != 4 || (50000 < (cpi->rc).avg_source_sad)))) {
          dVar19 = 1.0 - (double)((ulong)uVar17 << 0x20);
          iVar16 = (int)(dVar19 * (double)(thresholds[1] << 2) +
                        (double)((ulong)uVar17 << 0x20) * (double)thresholds[1]);
          iVar18 = (int)(dVar19 * (double)(thresholds[2] << 4) +
                        (double)((ulong)uVar17 << 0x20) * (double)thresholds[2]);
          *(int *)(thresholds + 1) = iVar16;
          *(uint *)((long)thresholds + 0xc) = -(uint)(iVar16 < 0);
          *(int *)(thresholds + 2) = iVar18;
          *(uint *)((long)thresholds + 0x14) = -(uint)(iVar18 < 0);
          thresholds[3] = 0x7fffffffffffffff;
        }
      }
      else if ((source_sad_nonrd != 4) || (50000 < (cpi->rc).avg_source_sad)) {
        *thresholds = (*thresholds >> 1) + *thresholds;
        thresholds[3] = 0x7fffffffffffffff;
        if (100 < (int)uVar1) {
          dVar19 = 1.0 - (double)((ulong)uVar17 << 0x20);
          iVar16 = (int)(dVar19 * (double)(thresholds[1] * 2) +
                        (double)((ulong)uVar17 << 0x20) * (double)thresholds[1]);
          iVar18 = (int)(dVar19 * (double)(thresholds[2] * 2) +
                        (double)((ulong)uVar17 << 0x20) * (double)thresholds[2]);
          *(int *)(thresholds + 1) = iVar16;
          *(uint *)((long)thresholds + 0xc) = -(uint)(iVar16 < 0);
          *(int *)(thresholds + 2) = iVar18;
          *(uint *)((long)thresholds + 0x14) = -(uint)(iVar18 < 0);
        }
      }
      goto LAB_002224db;
    }
    thresholds[3] = 0x7fffffffffffffff;
    thresholds[1] = thresholds[1] << (2U - is_segment_id_boosted & 0x3f);
    lVar15 = thresholds[2];
    bVar6 = 3;
    if (!is_segment_id_boosted) {
      bVar6 = source_sad_nonrd < 3 | 4;
    }
    thresholds[2] = lVar15 << bVar6;
    if ((cpi->svc).temporal_layer_id == 0) {
      iVar16 = (cpi->svc).number_temporal_layers;
      uVar13 = 25000;
      if (1 < iVar16) {
        uVar13 = 40000;
      }
      uVar9 = 50000;
      if (1 < iVar16) {
        uVar9 = 70000;
      }
    }
    else {
      uVar9 = 50000;
      uVar13 = 25000;
    }
    if ((((is_segment_id_boosted) || (blk_sad < 0x61a9)) || (uVar13 <= (cpi->rc).avg_source_sad)) ||
       ((lighting_change != 0 || (uVar9 <= blk_sad)))) goto LAB_002224db;
    lVar15 = (lVar15 << bVar6) * 3 >> 2;
    thresholds[2] = lVar15;
    lVar15 = lVar15 << 3;
  }
  thresholds[3] = lVar15;
LAB_002224db:
  if (((int)uVar1 < 0x80) && ((cpi->sf).part_sf.disable_8x8_part_based_on_qidx != 0)) {
    thresholds[3] = 0x7fffffffffffffff;
  }
  return;
}

Assistant:

static inline void set_vbp_thresholds(AV1_COMP *cpi, int64_t thresholds[],
                                      uint64_t blk_sad, int qindex,
                                      int content_lowsumdiff,
                                      int source_sad_nonrd, int source_sad_rd,
                                      bool is_segment_id_boosted,
                                      int lighting_change) {
  AV1_COMMON *const cm = &cpi->common;
  const int is_key_frame = frame_is_intra_only(cm);
  const int threshold_multiplier = is_key_frame ? 120 : 1;
  const int ac_q = av1_ac_quant_QTX(qindex, 0, cm->seq_params->bit_depth);
  int64_t threshold_base = (int64_t)(threshold_multiplier * ac_q);
  const int current_qindex = cm->quant_params.base_qindex;
  const int threshold_left_shift = cpi->sf.rt_sf.var_part_split_threshold_shift;
  const int num_pixels = cm->width * cm->height;

  if (is_key_frame) {
    set_vbp_thresholds_key_frame(cpi, thresholds, threshold_base,
                                 threshold_left_shift, num_pixels);
    return;
  }

  threshold_base = tune_base_thresh_content(
      cpi, threshold_base, content_lowsumdiff, source_sad_nonrd, num_pixels);
  thresholds[0] = threshold_base >> 1;
  thresholds[1] = threshold_base;
  thresholds[3] = threshold_base << threshold_left_shift;

  tune_thresh_based_on_resolution(cpi, thresholds, threshold_base,
                                  current_qindex, source_sad_rd, num_pixels);

  tune_thresh_based_on_qindex(cpi, thresholds, blk_sad, current_qindex,
                              num_pixels, is_segment_id_boosted,
                              source_sad_nonrd, lighting_change);
}